

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O3

void __thiscall
wasm::GenerateDynCalls::generateDynCallThunk(GenerateDynCalls *this,HeapType funcType)

{
  pointer *ppNVar1;
  undefined8 *puVar2;
  Module *this_00;
  __uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> _Var3;
  uintptr_t uVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  pointer pNVar8;
  Type *pTVar9;
  undefined8 *puVar10;
  Function *pFVar11;
  Export *pEVar12;
  IString *pIVar13;
  Table *pTVar14;
  Type *pTVar15;
  CallIndirect *pCVar16;
  undefined1 reuse;
  undefined8 in_RCX;
  Type params_00;
  ulong uVar17;
  pointer __args;
  int iVar18;
  pointer pNVar19;
  uint __len;
  uint __val;
  Type *__range1;
  bool bVar20;
  Signature sig_00;
  IString IVar21;
  string_view sVar22;
  Name name;
  undefined1 auStack_278 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  HeapType local_f0;
  HeapType funcType_local;
  Type local_e0;
  Expression *local_d8;
  Expression *local_d0;
  Builder local_c8;
  Builder builder;
  undefined1 local_b8 [8];
  Signature sig;
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  _Head_base<0UL,_wasm::Function_*,_false> local_80;
  undefined1 auStack_78 [8];
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> namedParams;
  undefined1 local_58 [8];
  Iterator __begin1_1;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *local_40;
  
  local_f0.id = funcType.id;
  _local_b8 = (Expression)HeapType::getSignature(&local_f0);
  bVar20 = local_b8._8_8_.id < 7;
  params_00.id = CONCAT71((int7)((ulong)in_RCX >> 8),bVar20);
  if (((undefined1  [16])_local_b8 & (undefined1  [16])0x1) != (undefined1  [16])0x0 && !bVar20) {
    Fatal::Fatal((Fatal *)auStack_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                _M_impl.super__Vector_impl_data._M_finish,
               "GenerateDynCalls: Cannot operate on multiple return values:",0x3b);
    Fatal::operator<<((Fatal *)auStack_278,&sig.params);
    Fatal::~Fatal((Fatal *)auStack_278);
  }
  if (this->onlyI64 == true) {
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _auStack_278 = _local_b8;
    auStack_78 = (undefined1  [8])&args;
    pNVar8 = (pointer)wasm::Type::size((Type *)&args);
    if (pNVar8 != (pointer)0x0) {
      do {
        pTVar9 = wasm::Type::Iterator::operator*((Iterator *)auStack_78);
        if (pTVar9->id == 3) goto LAB_00866ead;
        params_00.id = (long)&((namedParams.
                                super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                                _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str.
                              _M_len + 1;
        namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)params_00.id;
      } while (((pointer)params_00.id != pNVar8) || (auStack_78 != (undefined1  [8])&args));
    }
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_78 = (undefined1  [8])auStack_278;
    pNVar8 = (pointer)wasm::Type::size((Type *)auStack_278);
    if (pNVar8 == (pointer)0x0) {
      return;
    }
    while (pTVar9 = wasm::Type::Iterator::operator*((Iterator *)auStack_78), pTVar9->id != 3) {
      params_00.id = (long)&((namedParams.
                              super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                              _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str.
                            _M_len + 1;
      namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)params_00.id;
      if (((pointer)params_00.id == pNVar8) && (auStack_78 == (undefined1  [8])auStack_278)) {
        return;
      }
    }
  }
LAB_00866ead:
  this_00 = (this->
            super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
            ).super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
            .super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>.
            currModule;
  ppNVar1 = &namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl
             .super__Vector_impl_data._M_finish;
  local_c8.wasm = this_00;
  auStack_78 = (undefined1  [8])ppNVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_78,"dynCall_","");
  getSig_abi_cxx11_((string *)&sig.results,(wasm *)sig.params.id,(Type)local_b8,params_00);
  pNVar8 = (pointer)((long)&((namedParams.
                              super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                              _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str.
                            _M_len +
                    (long)&(params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start)->id);
  pNVar19 = (pointer)0xf;
  if (auStack_78 != (undefined1  [8])ppNVar1) {
    pNVar19 = namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (pNVar19 < pNVar8) {
    pNVar19 = (pointer)0xf;
    if ((pointer *)sig.results.id !=
        &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      pNVar19 = (pointer)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    if (pNVar8 <= pNVar19) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&sig.results,0,(char *)0x0,(ulong)auStack_78);
      goto LAB_00866f5d;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append(auStack_78,sig.results.id);
LAB_00866f5d:
  auStack_278 = (undefined1  [8])
                &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = puVar10 + 2;
  if ((pointer *)*puVar10 == (pointer *)puVar2) {
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*puVar2;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)puVar10[3];
  }
  else {
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*puVar2;
    auStack_278 = (undefined1  [8])*puVar10;
  }
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)puVar10[1];
  *puVar10 = puVar2;
  puVar10[1] = 0;
  *(undefined1 *)puVar2 = 0;
  sVar22._M_str = (char *)0x0;
  sVar22._M_len = (size_t)auStack_278;
  join_0x00000010_0x00000000_ =
       IString::interned((IString *)
                         args.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,sVar22,SUB81(puVar2,0));
  if (auStack_278 !=
      (undefined1  [8])
      &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_278,
                    (long)args.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  if ((pointer *)sig.results.id !=
      &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)sig.results.id,
                    (ulong)((long)&(params.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->id + 1));
  }
  if (auStack_78 != (undefined1  [8])ppNVar1) {
    operator_delete((void *)auStack_78,
                    (ulong)((long)&((namedParams.
                                     super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->name).
                                   super_IString.str._M_len + 1));
  }
  sVar22 = stack0xffffffffffffffb8;
  pFVar11 = Module::getFunctionOrNull(this_00,(Name)stack0xffffffffffffffb8);
  if ((pFVar11 == (Function *)0x0) &&
     (pEVar12 = Module::getExportOrNull(this_00,(Name)sVar22), pEVar12 == (Export *)0x0)) {
    auStack_78 = (undefined1  [8])0x0;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.results.id = 0;
    params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    builder.wasm = (Module *)
                   (this_00->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (builder.wasm ==
        (Module *)
        (this_00->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      IVar21.str = (string_view)Name::fromInt(0);
      pIVar13 = (IString *)operator_new(0x58);
      pIVar13[2].str._M_len = 0;
      *(char **)((long)(pIVar13 + 2) + 8) = (char *)0x0;
      pIVar13[1].str._M_len = 0;
      *(char **)((long)(pIVar13 + 1) + 8) = (char *)0x0;
      pIVar13[3].str._M_len = 0;
      auStack_278 = (undefined1  [8])pIVar13;
      pIVar13->str = IVar21.str;
      pIVar13[5].str._M_len = 0x12;
      *(char **)((long)(pIVar13 + 4) + 8) = (char *)0x2;
      *(char **)((long)(pIVar13 + 3) + 8) = (char *)0x0;
      reuse = 0xff;
      pIVar13[4].str._M_len = 0xffffffff;
      pTVar14 = Module::addTable(this_00,(unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>
                                          *)auStack_278);
      if ((__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)auStack_278 !=
          (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)0x0) {
        operator_delete((void *)auStack_278,0x58);
      }
      pcVar5 = DAT_010b0e58;
      (pTVar14->super_Importable).module.super_IString.str._M_len = ENV;
      (pTVar14->super_Importable).module.super_IString.str._M_str = pcVar5;
      sVar22 = IString::interned((IString *)&DAT_00000019,(string_view)ZEXT816(0xdbec2d),(bool)reuse
                                );
      (pTVar14->super_Importable).base.super_IString.str = sVar22;
      (pTVar14->addressType).id =
           *(uintptr_t *)
            ((long)(((this_00->memories).
                     super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t +
            0x50);
      builder.wasm = (Module *)
                     (this_00->tables).
                     super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    }
    std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
    emplace_back<char_const(&)[5],wasm::Type&>
              ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_78,
               (char (*) [5])"fptr",
               &((_Head_base<0UL,_wasm::Table_*,_false> *)
                &((builder.wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_head_impl->addressType);
    __args = ((builder.wasm)->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 9;
    if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start ==
        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&sig.results,
                 (iterator)
                 params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start,(Type *)__args);
    }
    else {
      (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_start)->id =
           (uintptr_t)
           (__args->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
           _M_t;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start =
           params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_58 = (undefined1  [8])local_b8;
    pTVar9 = (Type *)wasm::Type::size((Type *)local_b8);
    if ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
         pTVar9) || (local_58 != (undefined1  [8])local_b8)) {
      __val = 0;
      do {
        pTVar15 = wasm::Type::Iterator::operator*((Iterator *)local_58);
        __len = 1;
        if (9 < __val) {
          uVar17 = (ulong)__val;
          uVar6 = 4;
          do {
            __len = uVar6;
            uVar7 = (uint)uVar17;
            if (uVar7 < 100) {
              __len = __len - 2;
              goto LAB_00867243;
            }
            if (uVar7 < 1000) {
              __len = __len - 1;
              goto LAB_00867243;
            }
            if (uVar7 < 10000) goto LAB_00867243;
            uVar17 = uVar17 / 10000;
            uVar6 = __len + 4;
          } while (99999 < uVar7);
          __len = __len + 1;
        }
LAB_00867243:
        auStack_278 = (undefined1  [8])
                      &args.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct((ulong)auStack_278,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)auStack_278,__len,__val);
        std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
        emplace_back<std::__cxx11::string,wasm::Type_const&>
                  ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_278,
                   pTVar15);
        if (auStack_278 !=
            (undefined1  [8])
            &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)auStack_278,
                          (long)args.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1);
        }
        if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)&sig.results,
                     (iterator)
                     params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,pTVar15);
        }
        else {
          (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = pTVar15->id;
          params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        __val = __val + 1;
        __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin1_1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                parent != pTVar9) || (local_58 != (undefined1  [8])local_b8));
    }
    wasm::Type::Type(&local_e0,(Tuple *)&sig.results);
    sig_00.results.id = sig.params.id;
    sig_00.params.id = local_e0.id;
    HeapType::HeapType(&funcType_local,sig_00);
    _auStack_278 = (Expression)ZEXT816(0);
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    name.super_IString.str._M_str =
         (char *)__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                 index;
    name.super_IString.str._M_len = (size_t)&local_80;
    Builder::makeFunction
              (name,local_40,(HeapType)auStack_78,
               (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)funcType_local.id,
               (Expression *)auStack_278);
    if ((__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)auStack_278 !=
        (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)0x0) {
      operator_delete((void *)auStack_278,
                      (long)args.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_278);
    }
    ((local_80._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
    _Var3.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
         ((builder.wasm)->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[9]._M_t.
         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>;
    local_d0 = (Expression *)MixedArena::allocSpace(&(local_c8.wasm)->allocator,0x18,8);
    local_d0->_id = LocalGetId;
    *(undefined4 *)(local_d0 + 1) = 0;
    (local_d0->type).id =
         (uintptr_t)
         _Var3.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _auStack_278 = (Expression)ZEXT816(0);
    __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_58 = (undefined1  [8])local_b8;
    pTVar9 = (Type *)wasm::Type::size((Type *)local_b8);
    if ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
         pTVar9) || (local_58 != (undefined1  [8])local_b8)) {
      iVar18 = 1;
      do {
        do {
          pTVar15 = wasm::Type::Iterator::operator*((Iterator *)local_58);
          uVar4 = pTVar15->id;
          local_d8 = (Expression *)MixedArena::allocSpace(&(local_c8.wasm)->allocator,0x18,8);
          local_d8->_id = LocalGetId;
          *(int *)(local_d8 + 1) = iVar18;
          (local_d8->type).id = uVar4;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_278,
                     &local_d8);
          __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin1_1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
          iVar18 = iVar18 + 1;
        } while (__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                 parent != pTVar9);
      } while (local_58 != (undefined1  [8])local_b8);
    }
    pCVar16 = Builder::
              makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                        (&local_c8,
                         (IString)*(IString *)
                                   &(((builder.wasm)->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t,local_d0,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         auStack_278,local_f0,false);
    (local_80._M_head_impl)->body = (Expression *)pCVar16;
    Module::addFunction(this_00,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                                &local_80);
    pFVar11 = Module::getFunctionOrNull(this_00,(Name)stack0xffffffffffffffb8);
    if (pFVar11 == (Function *)0x0) {
      __assert_fail("!must_export",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GenerateDynCalls.cpp"
                    ,0x6b,"void wasm::exportFunction(Module &, Name, bool)");
    }
    pEVar12 = Module::getExportOrNull(this_00,(Name)stack0xffffffffffffffb8);
    if (pEVar12 == (Export *)0x0) {
      pEVar12 = (Export *)operator_new(0x30);
      (pEVar12->name).super_IString.str._M_len =
           __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
      (pEVar12->name).super_IString.str._M_str = (char *)local_40;
      pEVar12->kind = Function;
      *(size_t *)
       &(pEVar12->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
        super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
        super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
        super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
        super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
        super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u =
           __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
      *(vector<wasm::NameType,_std::allocator<wasm::NameType>_> **)
       ((long)&(pEVar12->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
               super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
               super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
               super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
               super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
               super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 8) = local_40;
      *(__index_type *)
       ((long)&(pEVar12->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
               super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
               super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
               super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
               super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
               super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) = '\0';
      Module::addExport(this_00,pEVar12);
    }
    if ((__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)auStack_278 !=
        (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)0x0) {
      operator_delete((void *)auStack_278,
                      (long)args.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_278);
    }
    if (local_80._M_head_impl != (Function *)0x0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)&local_80,local_80._M_head_impl);
    }
    if (sig.results.id != 0) {
      operator_delete((void *)sig.results.id,
                      (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - sig.results.id);
    }
    if (auStack_78 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_78,
                      (long)namedParams.
                            super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
    }
  }
  return;
}

Assistant:

void GenerateDynCalls::generateDynCallThunk(HeapType funcType) {
  Signature sig = funcType.getSignature();

  if (sig.results.isTuple()) {
    // Emscripten output is assumed to be MVP, and not to have multiple return
    // values. In particular, signatures in Emscripten all look like "abcd"
    // where "a" is the single return value, and "bcd" are the (in this case
    // three) parameters.
    Fatal() << "GenerateDynCalls: Cannot operate on multiple return values:"
            << sig.results;
  }

  if (onlyI64 && !hasI64(sig)) {
    return;
  }

  Module* wasm = getModule();
  Builder builder(*wasm);
  Name name = std::string("dynCall_") + getSig(sig.results, sig.params);
  if (wasm->getFunctionOrNull(name) || wasm->getExportOrNull(name)) {
    return; // module already contains this dyncall
  }
  std::vector<NameType> namedParams;
  std::vector<Type> params;
  if (wasm->tables.empty()) {
    // Add an imported table in exactly the same manner as the LLVM wasm backend
    // would add one.
    auto* table = wasm->addTable(Builder::makeTable(Name::fromInt(0)));
    table->module = ENV;
    table->base = "__indirect_function_table";
    table->addressType = wasm->memories[0]->addressType;
  }
  auto& table = wasm->tables[0];
  namedParams.emplace_back("fptr",
                           table->addressType); // function pointer param
  params.push_back(table->addressType);
  int p = 0;
  for (const auto& param : sig.params) {
    namedParams.emplace_back(std::to_string(p++), param);
    params.push_back(param);
  }
  auto f = builder.makeFunction(
    name, std::move(namedParams), Signature(Type(params), sig.results), {});
  f->hasExplicitName = true;
  Expression* fptr = builder.makeLocalGet(0, table->addressType);
  std::vector<Expression*> args;
  Index i = 0;
  for (const auto& param : sig.params) {
    args.push_back(builder.makeLocalGet(++i, param));
  }
  f->body = builder.makeCallIndirect(table->name, fptr, args, funcType);

  wasm->addFunction(std::move(f));
  exportFunction(*wasm, name, true);
}